

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::estimate_clock_resolution<std::chrono::_V2::steady_clock>
          (EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,int iterations)

{
  ClockDuration<std::chrono::_V2::steady_clock> how_long;
  Detail *pDVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  _func_vector<double,_std::allocator<double>_>_int **in_R8;
  double dVar2;
  code *local_48;
  TimingOf<std::chrono::_V2::steady_clock,_std::vector<double>_(*)(int),_run_for_at_least_argument_t<steady_clock,_vector<double,_allocator<double>_>_(*)(int)>_>
  local_40;
  
  last._M_current = (double *)&local_48;
  how_long.__r._4_4_ = 0;
  how_long.__r._0_4_ = iterations;
  local_48 = resolution<std::chrono::_V2::steady_clock>;
  run_for_at_least<std::chrono::_V2::steady_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (&local_40,(Detail *)0x1dcd6500,how_long,(int)&local_48,in_R8);
  dVar2 = 0.0;
  for (pDVar1 = (Detail *)
                local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pDVar1 != (Detail *)
                local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pDVar1 = pDVar1 + 8) {
    dVar2 = dVar2 + *(double *)pDVar1;
  }
  (__return_storage_ptr__->mean).__r =
       dVar2 / (double)((long)local_40.result.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_40.result.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&__return_storage_ptr__->outliers,
             (Detail *)
             local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,last);
  if ((Detail *)
      local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (Detail *)0x0) {
    operator_delete(local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.result.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.result.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EnvironmentEstimate<FloatDuration<Clock>> estimate_clock_resolution(int iterations) {
                auto r = run_for_at_least<Clock>(std::chrono::duration_cast<ClockDuration<Clock>>(clock_resolution_estimation_time), iterations, &resolution<Clock>)
                    .result;
                return {
                    FloatDuration<Clock>(mean(r.begin(), r.end())),
                    classify_outliers(r.begin(), r.end()),
                };
            }